

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O1

FT_Error cid_hex_to_binary(FT_Byte *data,FT_ULong data_len,FT_ULong offset,CID_Face face,
                          FT_ULong *data_written)

{
  FT_Stream stream;
  bool bVar1;
  byte bVar2;
  FT_Error FVar3;
  FT_Error FVar4;
  FT_ULong FVar5;
  char cVar6;
  uint uVar7;
  FT_ULong FVar8;
  byte *pbVar9;
  byte *pbVar10;
  bool bVar11;
  FT_Byte buffer [256];
  char local_162;
  FT_Byte *local_160;
  byte local_138 [264];
  
  stream = (face->root).stream;
  FVar3 = FT_Stream_Seek(stream,offset);
  local_160 = data;
  if (FVar3 == 0) {
    bVar11 = 0 < (long)data_len;
    if ((long)data_len < 1) {
      FVar3 = 0;
    }
    else {
      local_162 = '\x01';
      pbVar9 = local_138;
      pbVar10 = local_138;
LAB_0022a836:
      do {
        if (pbVar10 <= pbVar9) {
          FVar5 = FT_Stream_Pos(stream);
          FVar8 = stream->size - FVar5;
          if (FVar8 == 0) {
            bVar1 = false;
            FVar3 = 0xa0;
          }
          else {
            if (0xff < FVar8) {
              FVar8 = 0x100;
            }
            FVar4 = FT_Stream_Read(stream,local_138,FVar8);
            FVar3 = 0;
            if (FVar4 == 0) {
              FVar8 = FT_Stream_Pos(stream);
              pbVar10 = local_138 + (FVar8 - FVar5);
              bVar1 = true;
              pbVar9 = local_138;
            }
            else {
              bVar1 = false;
              FVar3 = FVar4;
            }
          }
          if (!bVar1) goto LAB_0022a96b;
        }
        bVar2 = *pbVar9;
        uVar7 = bVar2 - 0x30;
        if (uVar7 < 10) {
LAB_0022a8fe:
          cVar6 = (char)uVar7;
          bVar11 = true;
        }
        else {
          if ((byte)(bVar2 + 0x9f) < 6) {
            bVar2 = bVar2 + 0xa9;
LAB_0022a8fa:
            uVar7 = (uint)bVar2;
            goto LAB_0022a8fe;
          }
          if ((byte)(bVar2 + 0xbf) < 6) {
            bVar2 = bVar2 - 0x37;
            goto LAB_0022a8fa;
          }
          FVar3 = 0xa0;
          uVar7 = (uint)bVar2;
          if (0x3e < uVar7) goto LAB_0022a96b;
          if ((0x100003601U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
            pbVar9 = pbVar9 + 1;
            if (!bVar11) break;
            goto LAB_0022a836;
          }
          if ((ulong)uVar7 != 0x3e) goto LAB_0022a96b;
          cVar6 = '\0';
          bVar11 = false;
        }
        if (local_162 == '\0') {
          *local_160 = *local_160 + cVar6;
          local_160 = local_160 + 1;
        }
        else {
          *local_160 = cVar6 << 4;
        }
        if (!bVar11) {
          FVar3 = 0;
          goto LAB_0022a96b;
        }
        local_162 = '\x01' - local_162;
        pbVar9 = pbVar9 + 1;
        bVar11 = local_160 < data + data_len;
      } while (bVar11);
      FVar3 = 0;
    }
  }
LAB_0022a96b:
  *data_written = (long)local_160 - (long)data;
  return FVar3;
}

Assistant:

static FT_Error
  cid_hex_to_binary( FT_Byte*   data,
                     FT_ULong   data_len,
                     FT_ULong   offset,
                     CID_Face   face,
                     FT_ULong*  data_written )
  {
    FT_Stream  stream = face->root.stream;
    FT_Error   error;

    FT_Byte    buffer[256];
    FT_Byte   *p, *plimit;
    FT_Byte   *d = data, *dlimit;
    FT_Byte    val;

    FT_Bool    upper_nibble, done;


    if ( FT_STREAM_SEEK( offset ) )
      goto Exit;

    dlimit = d + data_len;
    p      = buffer;
    plimit = p;

    upper_nibble = 1;
    done         = 0;

    while ( d < dlimit )
    {
      if ( p >= plimit )
      {
        FT_ULong  oldpos = FT_STREAM_POS();
        FT_ULong  size   = stream->size - oldpos;


        if ( size == 0 )
        {
          error = FT_THROW( Syntax_Error );
          goto Exit;
        }

        if ( FT_STREAM_READ( buffer, 256 > size ? size : 256 ) )
          goto Exit;
        p      = buffer;
        plimit = p + FT_STREAM_POS() - oldpos;
      }

      if ( ft_isdigit( *p ) )
        val = (FT_Byte)( *p - '0' );
      else if ( *p >= 'a' && *p <= 'f' )
        val = (FT_Byte)( *p - 'a' + 10 );
      else if ( *p >= 'A' && *p <= 'F' )
        val = (FT_Byte)( *p - 'A' + 10 );
      else if ( *p == ' '  ||
                *p == '\t' ||
                *p == '\r' ||
                *p == '\n' ||
                *p == '\f' ||
                *p == '\0' )
      {
        p++;
        continue;
      }
      else if ( *p == '>' )
      {
        val  = 0;
        done = 1;
      }
      else
      {
        error = FT_THROW( Syntax_Error );
        goto Exit;
      }

      if ( upper_nibble )
        *d = (FT_Byte)( val << 4 );
      else
      {
        *d = (FT_Byte)( *d + val );
        d++;
      }

      upper_nibble = (FT_Byte)( 1 - upper_nibble );

      if ( done )
        break;

      p++;
    }

    error = FT_Err_Ok;

  Exit:
    *data_written = (FT_ULong)( d - data );
    return error;
  }